

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManCollectRing(Gia_Man_t *p,Vec_Int_t *vStart,Vec_Int_t *vRes,Vec_Int_t *vDists)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  Gia_Obj_t *pGVar12;
  long lVar13;
  
  if (0 < vStart->nSize) {
    lVar9 = 0;
    do {
      iVar1 = vStart->pArray[lVar9];
      lVar13 = (long)iVar1;
      if ((lVar13 < 0) || (vDists->nSize <= iVar1)) {
LAB_00246c12:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->nObjs <= iVar1) {
LAB_00246c31:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar2 = vDists->pArray[lVar13];
      if (iVar2 < 1) {
        __assert_fail("Weight > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                      ,0x91c,
                      "void Gia_ManCollectRing(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)")
        ;
      }
      pGVar12 = p->pObjs + lVar13;
      uVar10 = (uint)*(ulong *)pGVar12;
      uVar8 = *(ulong *)pGVar12 & 0x1fffffff;
      if (uVar8 != 0x1fffffff && -1 < (int)uVar10) {
        uVar7 = (uint)*(undefined8 *)(pGVar12 + -uVar8);
        uVar6 = uVar7 & 0x1fffffff;
        Gia_ManRingAdd(p,iVar1 - (uVar10 & 0x1fffffff),vRes,vDists,
                       (uint)(((int)uVar7 < 0 || uVar6 == 0x1fffffff) ||
                             uVar6 != ((uint)((ulong)*(undefined8 *)(pGVar12 + -uVar8) >> 0x20) &
                                      0x1fffffff)) + iVar2);
        uVar10 = (uint)(*(ulong *)pGVar12 >> 0x20);
        uVar7 = (uint)*(undefined8 *)(pGVar12 + -(ulong)(uVar10 & 0x1fffffff));
        uVar6 = uVar7 & 0x1fffffff;
        Gia_ManRingAdd(p,iVar1 - (uVar10 & 0x1fffffff),vRes,vDists,
                       (uint)(((int)uVar7 < 0 || uVar6 == 0x1fffffff) ||
                             uVar6 != ((uint)((ulong)*(undefined8 *)
                                                      (pGVar12 + -(ulong)(uVar10 & 0x1fffffff)) >>
                                             0x20) & 0x1fffffff)) + iVar2);
      }
      pVVar5 = p->vFanoutNums;
      if (pVVar5->nSize <= iVar1) goto LAB_00246c12;
      iVar11 = 0;
      while (iVar11 < pVVar5->pArray[lVar13]) {
        iVar3 = p->vFanout->nSize;
        if (iVar3 <= iVar1) goto LAB_00246c12;
        piVar4 = p->vFanout->pArray;
        uVar10 = piVar4[lVar13] + iVar11;
        if (((int)uVar10 < 0) || (iVar3 <= (int)uVar10)) goto LAB_00246c12;
        iVar3 = piVar4[uVar10];
        if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00246c31;
        uVar10 = (uint)*(undefined8 *)(p->pObjs + iVar3);
        uVar7 = uVar10 & 0x1fffffff;
        Gia_ManRingAdd(p,iVar3,vRes,vDists,
                       (uint)(((int)uVar10 < 0 || uVar7 == 0x1fffffff) ||
                             uVar7 != ((uint)((ulong)*(undefined8 *)(p->pObjs + iVar3) >> 0x20) &
                                      0x1fffffff)) + iVar2);
        iVar11 = iVar11 + 1;
        pVVar5 = p->vFanoutNums;
        if (pVVar5->nSize <= iVar1) goto LAB_00246c12;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vStart->nSize);
  }
  return;
}

Assistant:

void Gia_ManCollectRing( Gia_Man_t * p, Vec_Int_t * vStart, Vec_Int_t * vRes, Vec_Int_t * vDists )
{
    int i, k, iObj, iFan;
    Vec_IntForEachEntry( vStart, iObj, i )
    {
        int Weight = Vec_IntEntry( vDists, iObj );
        Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
        assert( Weight > 0 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ManRingAdd( p, Gia_ObjFaninId0(pObj, iObj), vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ObjFanin0(pObj)) );
            Gia_ManRingAdd( p, Gia_ObjFaninId1(pObj, iObj), vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ObjFanin1(pObj)) );
        }
        Gia_ObjForEachFanoutStaticId( p, iObj, iFan, k )
            Gia_ManRingAdd( p, iFan, vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ManObj(p, iFan)) );
    }
}